

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

bool comparesEqual(QTimeZone *lhs,QTimeZone *rhs)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  QTimeZonePrivate *in_RSI;
  ShortData *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QTimeZone::Data::isShort((Data *)in_RDI);
  if ((bool)uVar2) {
    bVar3 = QTimeZone::Data::isShort((Data *)in_RSI);
    local_19 = false;
    if (bVar3) {
      local_19 = operator==(*in_RDI,(ShortData)in_RSI->_vptr_QTimeZonePrivate);
    }
  }
  else {
    bVar3 = QTimeZone::Data::isShort((Data *)in_RSI);
    if (bVar3) {
      local_19 = false;
    }
    else if (*in_RDI == (ShortData)in_RSI->_vptr_QTimeZonePrivate) {
      local_19 = true;
    }
    else {
      local_19 = false;
      if ((*in_RDI != (ShortData)0x0) &&
         (local_19 = false, in_RSI->_vptr_QTimeZonePrivate != (_func_int **)0x0)) {
        local_19 = QTimeZonePrivate::operator==
                             (in_RSI,(QTimeZonePrivate *)
                                     CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffce,
                                                             CONCAT15(in_stack_ffffffffffffffcd,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffcc,
                                                  CONCAT13(bVar3,(uint3)CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8)))))));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool comparesEqual(const QTimeZone &lhs, const QTimeZone &rhs) noexcept
{
    if (lhs.d.isShort())
        return rhs.d.isShort() && lhs.d.s == rhs.d.s;

    if (!rhs.d.isShort()) {
        if (lhs.d.d == rhs.d.d)
            return true;
#if QT_CONFIG(timezone)
        return lhs.d.d && rhs.d.d && *lhs.d.d == *rhs.d.d;
#endif
    }

    return false;
}